

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O1

IVectorsVisualization * __thiscall iDynTree::Visualizer::vectors(Visualizer *this)

{
  return &(this->pimpl->m_invalidVectors).super_IVectorsVisualization;
}

Assistant:

IVectorsVisualization &Visualizer::vectors()
{
#ifdef IDYNTREE_USES_IRRLICHT
    if( !this->pimpl->m_isInitialized )
    {
        init();
    }
    return this->pimpl->m_vectors;
#else
    return this->pimpl->m_invalidVectors;
#endif
}